

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O2

void __thiscall
tcu::LogImage::LogImage
          (LogImage *this,string *name,string *description,ConstPixelBufferAccess *access,
          Vec4 *scale,Vec4 *bias,qpImageCompressionMode compression)

{
  ConstPixelBufferAccess *this_00;
  bool bVar1;
  ChannelOrder CVar2;
  ConstPixelBufferAccess local_58;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)description);
  this_00 = &this->m_access;
  ConstPixelBufferAccess::ConstPixelBufferAccess(this_00,access);
  Vector<float,_4>::Vector(&this->m_scale,scale);
  Vector<float,_4>::Vector(&this->m_bias,bias);
  this->m_compression = compression;
  bVar1 = isCombinedDepthStencilType((access->m_format).type);
  if (bVar1) {
    CVar2 = (access->m_format).order;
    if (CVar2 == D) {
      getEffectiveDepthStencilAccess(&local_58,access,MODE_DEPTH);
      (this->m_access).m_data = local_58.m_data;
      *(undefined8 *)((this->m_access).m_size.m_data + 2) = local_58._16_8_;
      *(undefined8 *)((this->m_access).m_pitch.m_data + 1) = local_58.m_pitch.m_data._4_8_;
      this_00->m_format = local_58.m_format;
      *(undefined8 *)(this->m_access).m_size.m_data = local_58.m_size.m_data._0_8_;
      CVar2 = (access->m_format).order;
    }
    if (CVar2 == S) {
      getEffectiveDepthStencilAccess(&local_58,access,MODE_STENCIL);
      (this->m_access).m_data = local_58.m_data;
      *(undefined8 *)((this->m_access).m_size.m_data + 2) = local_58._16_8_;
      *(undefined8 *)((this->m_access).m_pitch.m_data + 1) = local_58.m_pitch.m_data._4_8_;
      this_00->m_format = local_58.m_format;
      *(undefined8 *)(this->m_access).m_size.m_data = local_58.m_size.m_data._0_8_;
    }
  }
  return;
}

Assistant:

LogImage::LogImage (const std::string& name, const std::string& description, const ConstPixelBufferAccess& access, const Vec4& scale, const Vec4& bias, qpImageCompressionMode compression)
	: m_name		(name)
	, m_description	(description)
	, m_access		(access)
	, m_scale		(scale)
	, m_bias		(bias)
	, m_compression	(compression)
{
	// Cannot set scale and bias of combined formats
	DE_ASSERT(access.getFormat().order != tcu::TextureFormat::DS);

	// Simplify access
	if (tcu::isCombinedDepthStencilType(access.getFormat().type))
	{
		if (access.getFormat().order == tcu::TextureFormat::D)
			m_access = tcu::getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_DEPTH);
		if (access.getFormat().order == tcu::TextureFormat::S)
			m_access = tcu::getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_STENCIL);
		else
		{
			// Cannot log a DS format
			DE_ASSERT(false);
			return;
		}
	}
}